

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void xmlResetError(xmlErrorPtr err)

{
  if ((err != (xmlErrorPtr)0x0) && (err->code != 0)) {
    if (err->message != (char *)0x0) {
      (*xmlFree)(err->message);
    }
    if (err->file != (char *)0x0) {
      (*xmlFree)(err->file);
    }
    if (err->str1 != (char *)0x0) {
      (*xmlFree)(err->str1);
    }
    if (err->str2 != (char *)0x0) {
      (*xmlFree)(err->str2);
    }
    if (err->str3 != (char *)0x0) {
      (*xmlFree)(err->str3);
    }
    err->int1 = 0;
    err->int2 = 0;
    err->ctxt = (void *)0x0;
    err->str2 = (char *)0x0;
    err->str3 = (char *)0x0;
    *(undefined8 *)&err->line = 0;
    err->str1 = (char *)0x0;
    *(undefined8 *)&err->level = 0;
    err->file = (char *)0x0;
    err->domain = 0;
    err->code = 0;
    err->message = (char *)0x0;
    err->node = (void *)0x0;
  }
  return;
}

Assistant:

void
xmlResetError(xmlErrorPtr err)
{
    if (err == NULL)
        return;
    if (err->code == XML_ERR_OK)
        return;
    if (err->message != NULL)
        xmlFree(err->message);
    if (err->file != NULL)
        xmlFree(err->file);
    if (err->str1 != NULL)
        xmlFree(err->str1);
    if (err->str2 != NULL)
        xmlFree(err->str2);
    if (err->str3 != NULL)
        xmlFree(err->str3);
    memset(err, 0, sizeof(xmlError));
    err->code = XML_ERR_OK;
}